

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndDisabled(void)

{
  int iVar1;
  uint uVar2;
  ImGuiItemFlags IVar3;
  ImGuiContext *pIVar4;
  
  pIVar4 = GImGui;
  GImGui->DisabledStackSize = GImGui->DisabledStackSize + -1;
  iVar1 = (pIVar4->ItemFlagsStack).Size;
  (pIVar4->ItemFlagsStack).Size = iVar1 + -1;
  uVar2 = (pIVar4->ItemFlagsStack).Data[(long)iVar1 + -2];
  IVar3 = pIVar4->CurrentItemFlags;
  pIVar4->CurrentItemFlags = uVar2;
  if (((IVar3 & 4) != 0) && ((uVar2 & 4) == 0)) {
    (pIVar4->Style).Alpha = pIVar4->DisabledAlphaBackup;
  }
  return;
}

Assistant:

void ImGui::EndDisabled()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.DisabledStackSize > 0);
    g.DisabledStackSize--;
    bool was_disabled = (g.CurrentItemFlags & ImGuiItemFlags_Disabled) != 0;
    //PopItemFlag();
    g.ItemFlagsStack.pop_back();
    g.CurrentItemFlags = g.ItemFlagsStack.back();
    if (was_disabled && (g.CurrentItemFlags & ImGuiItemFlags_Disabled) == 0)
        g.Style.Alpha = g.DisabledAlphaBackup; //PopStyleVar();
}